

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O2

bool __thiscall EventHandler::vector3Moved(EventHandler *this,JoyStickEvent *arg,int index)

{
  ostream *poVar1;
  long lVar2;
  
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 2;
  *(undefined4 *)(XOpenDisplay + *(long *)(lVar2 + -0x18)) = 0x84;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,(string *)(*(long *)(arg + 8) + 8));
  poVar1 = std::operator<<(poVar1,". Orientation # ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
  poVar1 = std::operator<<(poVar1," X Value: ");
  lVar2 = (long)index * 0x10;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 4 + lVar2));
  poVar1 = std::operator<<(poVar1," Y Value: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 8 + lVar2));
  poVar1 = std::operator<<(poVar1," Z Value: ");
  std::ostream::operator<<(poVar1,*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 0xc + lVar2))
  ;
  return true;
}

Assistant:

bool vector3Moved(const JoyStickEvent& arg, int index)
	{
		std::cout.precision(2);
		std::cout.flags(std::ios::fixed | std::ios::right);
		std::cout << std::endl
				  << arg.device->vendor() << ". Orientation # " << index
				  << " X Value: " << arg.state.mVectors[index].x
				  << " Y Value: " << arg.state.mVectors[index].y
				  << " Z Value: " << arg.state.mVectors[index].z;
		std::cout.precision();
		std::cout.flags();
		return true;
	}